

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyBuffer
          (VulkanCommandBuffer *this,VkBuffer srcBuffer,VkBuffer dstBuffer,uint32_t regionCount,
          VkBufferCopy *pRegions)

{
  undefined4 in_register_0000000c;
  string msg;
  string local_50;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,regionCount));
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x200);
    std::__cxx11::string::~string((string *)&local_50);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdCopyBuffer)(this->m_VkCmdBuffer,srcBuffer,dstBuffer,regionCount,pRegions);
  return;
}

Assistant:

__forceinline void CopyBuffer(VkBuffer            srcBuffer,
                                  VkBuffer            dstBuffer,
                                  uint32_t            regionCount,
                                  const VkBufferCopy* pRegions)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy buffer operation must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyBuffer(m_VkCmdBuffer, srcBuffer, dstBuffer, regionCount, pRegions);
    }